

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,GenerationOptions *generation_options)

{
  bool bVar1;
  ObjectiveCType OVar2;
  MapFieldGenerator *this;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  OVar2 = GetObjectiveCType(field);
  if (bVar1) {
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      this = (MapFieldGenerator *)operator_new(0x50);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,generation_options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        this = (MapFieldGenerator *)operator_new(0x58);
        MapFieldGenerator::MapFieldGenerator(this,field,generation_options);
      }
      else {
        this = (MapFieldGenerator *)operator_new(0x50);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)this,field,generation_options);
      }
    }
    else {
      this = (MapFieldGenerator *)operator_new(0x50);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,generation_options);
    }
  }
  else if (OVar2 == OBJECTIVECTYPE_ENUM) {
    this = (MapFieldGenerator *)operator_new(0x50);
    EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,generation_options);
  }
  else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
    this = (MapFieldGenerator *)operator_new(0x50);
    MessageFieldGenerator::MessageFieldGenerator
              ((MessageFieldGenerator *)this,field,generation_options);
  }
  else {
    bVar1 = IsReferenceType(field);
    this = (MapFieldGenerator *)operator_new(0x50);
    if (bVar1) {
      PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                ((PrimitiveObjFieldGenerator *)this,field,generation_options);
    }
    else {
      PrimitiveFieldGenerator::PrimitiveFieldGenerator
                ((PrimitiveFieldGenerator *)this,field,generation_options);
    }
  }
  return (FieldGenerator *)this;
}

Assistant:

FieldGenerator* FieldGenerator::Make(
    const FieldDescriptor* field, const GenerationOptions& generation_options) {
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          return new MapFieldGenerator(field, generation_options);
        } else {
          return new RepeatedMessageFieldGenerator(field, generation_options);
        }
      }
      case OBJECTIVECTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, generation_options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, generation_options);
    }
  }

  switch (GetObjectiveCType(field)) {
    case OBJECTIVECTYPE_MESSAGE: {
      return new MessageFieldGenerator(field, generation_options);
    }
    case OBJECTIVECTYPE_ENUM:
      return new EnumFieldGenerator(field, generation_options);
    default:
      if (IsReferenceType(field)) {
        return new PrimitiveObjFieldGenerator(field, generation_options);
      } else {
        return new PrimitiveFieldGenerator(field, generation_options);
      }
  }
}